

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall cxxopts::values::abstract_value<bool>::abstract_value(abstract_value<bool> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Value).super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Value).super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__abstract_value_0013a7a0;
  (this->m_result).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0013a820;
  *(undefined1 *)&p_Var1[1]._vptr__Sp_counted_base = 0;
  (this->m_result).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  (this->m_result).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  this->m_store = (bool *)(p_Var1 + 1);
  this->m_default = false;
  this->m_implicit = false;
  (this->m_default_value)._M_dataplus._M_p = (pointer)&(this->m_default_value).field_2;
  (this->m_default_value)._M_string_length = 0;
  (this->m_default_value).field_2._M_local_buf[0] = '\0';
  (this->m_implicit_value)._M_dataplus._M_p = (pointer)&(this->m_implicit_value).field_2;
  (this->m_implicit_value)._M_string_length = 0;
  (this->m_implicit_value).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

abstract_value()
      : m_result(std::make_shared<T>())
      , m_store(m_result.get())
      {
      }